

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_cs_example.cc
# Opt level: O2

void GEN_CS::gen_cs_example_mtr(cb_to_cs_adf *c,multi_ex *ec_seq,label *cs_labels)

{
  float *pfVar1;
  bool bVar2;
  pointer ppeVar3;
  size_t i;
  ulong uVar4;
  long lVar5;
  wclass wc;
  wclass local_48;
  cb_to_cs_adf *local_38;
  
  bVar2 = CB::ec_is_example_header
                    (*(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                      super__Vector_impl_data._M_start);
  ppeVar3 = (c->mtr_ec_seq).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  c->action_sum =
       (c->action_sum - (ulong)bVar2) +
       ((long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3);
  c->event_sum = c->event_sum + 1;
  if ((c->mtr_ec_seq).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppeVar3) {
    (c->mtr_ec_seq).super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppeVar3;
  }
  local_38 = c;
  v_array<COST_SENSITIVE::wclass>::clear(&cs_labels->costs);
  lVar5 = 0;
  uVar4 = 0;
  do {
    ppeVar3 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppeVar3 >> 3) <= uVar4) {
      return;
    }
    pfVar1 = *(float **)(*(long *)((long)ppeVar3 + lVar5) + 0x6828);
    local_48.partial_prediction = 0.0;
    local_48.wap_value = 0.0;
    if (uVar4 == 0 && bVar2) {
      local_48.x = -3.4028235e+38;
      local_48.class_index = 0;
LAB_0022e385:
      std::vector<example_*,_std::allocator<example_*>_>::push_back
                (&c->mtr_ec_seq,(value_type *)((long)ppeVar3 + lVar5));
      v_array<COST_SENSITIVE::wclass>::push_back(&cs_labels->costs,&local_48);
    }
    else if (*(long *)(*(long *)((long)ppeVar3 + lVar5) + 0x6830) - (long)pfVar1 == 0x10) {
      local_48.x = *pfVar1;
      if ((local_48.x != 3.4028235e+38) || (NAN(local_48.x))) {
        local_48.class_index = 0;
        local_38->mtr_example = (uint32_t)uVar4;
        ppeVar3 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        goto LAB_0022e385;
      }
    }
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 8;
  } while( true );
}

Assistant:

void gen_cs_example_mtr(cb_to_cs_adf& c, multi_ex& ec_seq, COST_SENSITIVE::label& cs_labels)
{
  bool shared = CB::ec_is_example_header(*(ec_seq[0]));
  c.action_sum += ec_seq.size();
  if (shared)
    c.action_sum -= 1;
  c.event_sum++;

  c.mtr_ec_seq.clear();
  cs_labels.costs.clear();
  for (size_t i = 0; i < ec_seq.size(); i++)
  {
    CB::label ld = ec_seq[i]->l.cb;

    COST_SENSITIVE::wclass wc = {0, 0, 0, 0};

    bool keep_example = false;
    if (shared && i == 0)
    {
      wc.x = -FLT_MAX;
      keep_example = true;
    }
    else if (ld.costs.size() == 1 && ld.costs[0].cost != FLT_MAX)
    {
      wc.x = ld.costs[0].cost;
      c.mtr_example = (uint32_t)i;
      keep_example = true;
    }
    if (keep_example)
    {
      c.mtr_ec_seq.push_back(ec_seq[i]);
      cs_labels.costs.push_back(wc);
    }
  }
}